

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

char * __thiscall pstack::Context::dirname(Context *this,char *__path)

{
  long lVar1;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  size_type sVar2;
  
  if (in_RDX->_M_string_length == 0) {
LAB_001570e4:
    __n = 0xffffffffffffffff;
  }
  else {
    sVar2 = in_RDX->_M_string_length;
    do {
      __n = sVar2 - 1;
      if (sVar2 == 0) goto LAB_001570e4;
      lVar1 = sVar2 - 1;
      sVar2 = __n;
    } while ((in_RDX->_M_dataplus)._M_p[lVar1] != '/');
  }
  if (__n == 0xffffffffffffffff) {
    *(_Base_ptr **)&(this->dwarfCache)._M_t._M_impl =
         &(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)this,".","");
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,in_RDX,0,
               __n);
  }
  return (char *)this;
}

Assistant:

std::string
Context::dirname(const std::string &in)
{
    auto it = in.rfind('/');
    if (it == std::string::npos)
        return ".";
    return in.substr(0, it);
}